

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget.cpp
# Opt level: O3

void __thiscall QWidgetPrivate::updateContentsRect(QWidgetPrivate *this)

{
  uint uVar1;
  QObject *pQVar2;
  long lVar3;
  undefined1 auVar4 [16];
  long in_FS_OFFSET;
  QSize local_48;
  QSize local_40;
  undefined1 *local_38;
  undefined1 *puStack_30;
  undefined1 *local_28;
  undefined1 *puStack_20;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar2 = *(QObject **)&this->field_0x8;
  if (this->layout == (QLayout *)0x0) {
    updateGeometry_helper(*(QWidgetPrivate **)(pQVar2 + 8),false);
  }
  else {
    QLayout::update(this->layout);
  }
  lVar3 = *(long *)(pQVar2 + 0x20);
  if ((*(byte *)(lVar3 + 9) & 0x80) == 0) {
    uVar1 = *(uint *)(*(long *)(pQVar2 + 8) + 0x240);
    if ((uVar1 & 8) == 0) {
      *(uint *)(*(long *)(pQVar2 + 8) + 0x240) = uVar1 | 8;
    }
  }
  else {
    auVar4._4_4_ = *(int *)(lVar3 + 0x20) - *(int *)(lVar3 + 0x18);
    auVar4._0_4_ = *(int *)(lVar3 + 0x1c) - *(int *)(lVar3 + 0x14);
    auVar4._8_8_ = 0;
    update<QRect>(*(QWidgetPrivate **)(pQVar2 + 8),(QRect)(auVar4 << 0x40));
    local_28 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_20 = &DAT_aaaaaaaaaaaaaaaa;
    local_38 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_30 = &DAT_aaaaaaaaaaaaaaaa;
    lVar3 = *(long *)(pQVar2 + 0x20);
    local_48.wd.m_i = (*(int *)(lVar3 + 0x1c) - *(int *)(lVar3 + 0x14)) + 1;
    local_48.ht.m_i = (*(int *)(lVar3 + 0x20) - *(int *)(lVar3 + 0x18)) + 1;
    local_40 = local_48;
    QResizeEvent::QResizeEvent((QResizeEvent *)&local_38,&local_40,&local_48);
    QCoreApplication::sendEvent(pQVar2,(QEvent *)&local_38);
    QResizeEvent::~QResizeEvent((QResizeEvent *)&local_38);
  }
  local_38 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_30 = &DAT_aaaaaaaaaaaaaaaa;
  QEvent::QEvent((QEvent *)&local_38,ContentsRectChange);
  QCoreApplication::sendEvent(pQVar2,(QEvent *)&local_38);
  QEvent::~QEvent((QEvent *)&local_38);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QWidgetPrivate::updateContentsRect()
{
    Q_Q(QWidget);

    if (layout)
        layout->update(); //force activate; will do updateGeometry
    else
        q->updateGeometry();

    if (q->isVisible()) {
        q->update();
        QResizeEvent e(q->data->crect.size(), q->data->crect.size());
        QCoreApplication::sendEvent(q, &e);
    } else {
        q->setAttribute(Qt::WA_PendingResizeEvent, true);
    }

    QEvent e(QEvent::ContentsRectChange);
    QCoreApplication::sendEvent(q, &e);
}